

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O0

int sysbvm_type_computeDepth(sysbvm_tuple_t type)

{
  int iVar1;
  sysbvm_tuple_t type_00;
  sysbvm_tuple_t type_local;
  
  if (type == 0) {
    type_local._4_4_ = -1;
  }
  else {
    type_00 = sysbvm_type_getSupertype(type);
    iVar1 = sysbvm_type_computeDepth(type_00);
    type_local._4_4_ = iVar1 + 1;
  }
  return type_local._4_4_;
}

Assistant:

SYSBVM_API int sysbvm_type_computeDepth(sysbvm_tuple_t type)
{
    if(!type)
        return -1;

    return sysbvm_type_computeDepth(sysbvm_type_getSupertype(type)) + 1;
}